

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<short,_long_double>::Run
          (DataTransform<short,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  NumericType NVar2;
  WarningType WVar3;
  bool bVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ulong uVar8;
  ostream *poVar9;
  size_t sVar10;
  int iVar11;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  short input_data;
  string word;
  char buffer [128];
  short local_2a4;
  ushort local_2a2;
  ushort local_2a0;
  ushort local_29e;
  ushort local_29c;
  ushort local_29a;
  short local_298;
  short local_296;
  longdouble local_294;
  string local_288;
  string *local_268;
  double local_260;
  double local_258;
  long local_250;
  long local_248;
  ulong local_240;
  ulong local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_268 = &this->print_format_;
  iVar11 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar4 = true;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        local_294 = (longdouble)CONCAT64(local_294._4_6_,*piVar6);
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_288);
        if (local_288._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_0011b442:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = local_294._0_4_;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_0011b442;
        }
        local_29a = in_FPUControlWord | 0xc00;
        local_2a4 = (short)ROUND(in_ST0);
        bVar4 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_296 = local_2a4;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar5) goto LAB_0011b034;
      if (bVar4) {
        if (bVar4) {
LAB_0011b3ee:
          bVar5 = true;
          if ((this->is_ascii_output_ == true) && (iVar11 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_0011b42c:
          bVar5 = false;
        }
        return bVar5;
      }
    }
    else {
      bVar5 = sptk::ReadStream<short>(&local_2a4,input_stream);
      if (!bVar5) goto LAB_0011b3ee;
LAB_0011b034:
      uVar8 = (ulong)local_2a4;
      local_298 = local_2a4;
      lVar12 = (longdouble)local_2a4;
      lVar13 = this->minimum_value_;
      lVar1 = this->maximum_value_;
      if (lVar13 < lVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if ((lVar13 <= lVar12) && (lVar13 = lVar1, lVar12 <= lVar1)) goto LAB_0011b0dc;
        }
        else if (NVar2 == kUnsignedInteger) {
          lVar14 = (longdouble)9.223372e+18;
          lVar15 = (longdouble)0;
          if (lVar14 <= lVar13) {
            lVar15 = lVar14;
          }
          local_2a0 = in_FPUControlWord | 0xc00;
          local_238 = (ulong)ROUND(lVar13 - lVar15);
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          if (((ulong)(lVar14 <= lVar13) << 0x3f ^ local_238) <= uVar8) {
            lVar15 = (longdouble)9.223372e+18;
            lVar13 = (longdouble)0;
            if (lVar15 <= lVar1) {
              lVar13 = lVar15;
            }
            local_2a2 = in_FPUControlWord | 0xc00;
            local_240 = (ulong)ROUND(lVar1 - lVar13);
            bVar5 = ((ulong)(lVar15 <= lVar1) << 0x3f ^ local_240) < uVar8;
            lVar13 = lVar12;
            if (bVar5) {
              lVar13 = lVar1;
            }
            goto LAB_0011b0e0;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0011b0dc;
          local_29c = in_FPUControlWord | 0xc00;
          local_248 = (long)ROUND(lVar13);
          in_ST4 = in_ST3;
          if (local_248 <= (long)uVar8) {
            local_29e = in_FPUControlWord | 0xc00;
            local_250 = (long)ROUND(lVar1);
            bVar5 = local_250 < (long)uVar8;
            lVar13 = lVar12;
            if (bVar5) {
              lVar13 = lVar1;
            }
            goto LAB_0011b0e0;
          }
        }
LAB_0011b20b:
        if (this->warning_type_ != kIgnore) {
          local_294 = lVar13;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"x2x","");
          sptk::PrintErrorMessage(&local_288,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          lVar13 = local_294;
          if (WVar3 == kExit) goto LAB_0011b42c;
        }
      }
      else {
LAB_0011b0dc:
        bVar5 = false;
        lVar13 = lVar12;
LAB_0011b0e0:
        if ((bVar5) || (this->rounding_ == false)) {
          if (bVar5) goto LAB_0011b20b;
        }
        else if (local_2a4 < 1) {
          local_258 = (double)(int)local_2a4 + -0.5;
          lVar13 = (longdouble)local_258;
        }
        else {
          local_260 = (double)(int)local_2a4 + 0.5;
          lVar13 = (longdouble)local_260;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<long_double>(lVar13,local_268,0x80,local_b8);
        if (!bVar5) goto LAB_0011b42c;
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if ((iVar11 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
          in_ST7 = in_ST4;
        }
      }
      else {
        bVar5 = sptk::WriteStream<long_double>(lVar13,(ostream *)&std::cout);
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        in_ST7 = in_ST4;
        if (!bVar5) goto LAB_0011b42c;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }